

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nng.c
# Opt level: O2

int nng_msg_trim_u32(nng_msg *m,uint32_t *vp)

{
  uint uVar1;
  int iVar2;
  size_t sVar3;
  uint *puVar4;
  
  sVar3 = nni_msg_len(m);
  if (sVar3 < 4) {
    iVar2 = 3;
  }
  else {
    puVar4 = (uint *)nni_msg_body(m);
    uVar1 = *puVar4;
    nni_msg_trim(m,4);
    *vp = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int
nng_msg_trim_u32(nng_msg *m, uint32_t *vp)
{
	uint8_t *body;
	uint32_t v;
	if (nni_msg_len(m) < sizeof(v)) {
		return (NNG_EINVAL);
	}
	body = nni_msg_body(m);
	NNI_GET32(body, v);
	(void) nni_msg_trim(m, sizeof(v));
	*vp = v;
	return (0);
}